

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O0

bool __thiscall CInput::MouseRelative(CInput *this,float *pX,float *pY)

{
  float *in_RDX;
  float *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int MouseY;
  int MouseX;
  bool local_11;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(in_RDI + 0x1248) & 1) == 0) {
    local_11 = false;
  }
  else {
    local_c = 0;
    local_10 = 0;
    SDL_GetRelativeMouseState(&local_c,&local_10);
    if ((local_c == 0) && (local_10 == 0)) {
      local_11 = false;
    }
    else {
      *in_RSI = (float)local_c;
      *in_RDX = (float)local_10;
      local_11 = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_11;
  }
  __stack_chk_fail();
}

Assistant:

bool CInput::MouseRelative(float *pX, float *pY)
{
	if(!m_MouseInputRelative)
		return false;

	int MouseX = 0, MouseY = 0;
	SDL_GetRelativeMouseState(&MouseX, &MouseY);
	if(MouseX || MouseY)
	{
		*pX = MouseX;
		*pY = MouseY;
		return true;
	}
	return false;
}